

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::DeconvolutionDepthWise_x86_avx512::create_pipeline
          (DeconvolutionDepthWise_x86_avx512 *this,Option *opt)

{
  Mat *pMVar1;
  uint uVar2;
  uint uVar3;
  int _h;
  int *piVar4;
  Allocator *pAVar5;
  void *pvVar6;
  int iVar7;
  undefined4 *puVar8;
  undefined4 *puVar9;
  ulong uVar10;
  byte bVar11;
  int iVar12;
  int _w;
  ulong uVar13;
  Mat local_c0;
  Mat local_78;
  
  if ((this->super_DeconvolutionDepthWise).dynamic_weight != 0) {
    return 0;
  }
  uVar13 = (long)(this->super_DeconvolutionDepthWise).kernel_h *
           (long)(this->super_DeconvolutionDepthWise).kernel_w;
  uVar2 = (this->super_DeconvolutionDepthWise).num_output;
  uVar3 = (this->super_DeconvolutionDepthWise).group;
  uVar10 = (long)(this->super_DeconvolutionDepthWise).weight_data_size / (long)(int)uVar3;
  _w = (int)uVar13;
  uVar10 = (long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff) / (long)_w;
  if ((uVar3 != uVar2) ||
     ((int)((long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff) /
           (long)((int)uVar2 / (int)uVar3)) * uVar3 != uVar3)) {
    create_group_ops(this,opt);
    if (opt->lightmode != true) {
      return 0;
    }
    piVar4 = (this->super_DeconvolutionDepthWise).weight_data.refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        pvVar6 = (this->super_DeconvolutionDepthWise).weight_data.data;
        pAVar5 = (this->super_DeconvolutionDepthWise).weight_data.allocator;
        if (pAVar5 == (Allocator *)0x0) {
          if (pvVar6 != (void *)0x0) {
            free(pvVar6);
          }
        }
        else {
          (*pAVar5->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_DeconvolutionDepthWise).weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_DeconvolutionDepthWise).weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_DeconvolutionDepthWise).weight_data.elemsize + 4) = 0;
    (this->super_DeconvolutionDepthWise).weight_data.data = (void *)0x0;
    (this->super_DeconvolutionDepthWise).weight_data.refcount = (int *)0x0;
    (this->super_DeconvolutionDepthWise).weight_data.dims = 0;
    (this->super_DeconvolutionDepthWise).weight_data.w = 0;
    (this->super_DeconvolutionDepthWise).weight_data.h = 0;
    (this->super_DeconvolutionDepthWise).weight_data.d = 0;
    (this->super_DeconvolutionDepthWise).weight_data.c = 0;
    return 0;
  }
  bVar11 = 1;
  if (opt->use_packing_layout == true) {
    if ((uVar3 & 0xf) == 0) {
      bVar11 = 0x10;
    }
    else if ((uVar3 & 7) == 0) {
      bVar11 = 8;
    }
    else {
      bVar11 = ((uVar3 & 3) == 0) * '\x03' + 1;
    }
  }
  pMVar1 = &(this->super_DeconvolutionDepthWise).weight_data;
  local_78.cstep = 0;
  local_78.data = (Allocator *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_78.elempack = 0;
  iVar12 = 0;
  local_78.allocator = (Allocator *)local_78.data;
  local_78.dims = (int)local_78.refcount;
  local_78.w = local_78.refcount._4_4_;
  local_78._48_8_ = local_78.elemsize;
  local_78.c = local_78.elempack;
  Mat::create(&local_78,(this->super_DeconvolutionDepthWise).weight_data.w,4,(Allocator *)0x0);
  _h = (this->super_DeconvolutionDepthWise).group;
  iVar7 = (uVar3 - (int)uVar3 % _h) * ((this->super_DeconvolutionDepthWise).num_output / _h);
  if (0 < iVar7) {
    pvVar6 = pMVar1->data;
    puVar8 = (undefined4 *)((long)local_78.data + uVar13 * 4 + -4);
    do {
      if (0 < _w) {
        uVar10 = 0;
        puVar9 = puVar8;
        do {
          *puVar9 = *(undefined4 *)((long)pvVar6 + uVar10 * 4);
          uVar10 = uVar10 + 1;
          puVar9 = puVar9 + -1;
        } while ((uVar13 & 0xffffffff) != uVar10);
      }
      iVar12 = iVar12 + 1;
      pvVar6 = (void *)((long)pvVar6 + uVar13 * 4);
      puVar8 = puVar8 + uVar13;
    } while (iVar12 != iVar7);
  }
  if (bVar11 < 8) {
    if (bVar11 == 1) {
      if (&this->weight_data_tm != &local_78) {
        piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,(int)local_78.refcount);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = (this->weight_data_tm).refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            pvVar6 = (this->weight_data_tm).data;
            pAVar5 = (this->weight_data_tm).allocator;
            if (pAVar5 == (Allocator *)0x0) {
              if (pvVar6 != (void *)0x0) {
                free(pvVar6);
              }
            }
            else {
              (*pAVar5->_vptr_Allocator[3])();
            }
          }
        }
        (this->weight_data_tm).data = local_78.data;
        (this->weight_data_tm).refcount =
             (int *)CONCAT44(local_78.refcount._4_4_,(int)local_78.refcount);
        (this->weight_data_tm).elemsize = local_78.elemsize;
        (this->weight_data_tm).elempack = local_78.elempack;
        (this->weight_data_tm).allocator = local_78.allocator;
        (this->weight_data_tm).dims = local_78.dims;
        (this->weight_data_tm).w = local_78.w;
        (this->weight_data_tm).h = local_78.h;
        (this->weight_data_tm).d = local_78.d;
        (this->weight_data_tm).c = local_78.c;
        (this->weight_data_tm).cstep = local_78.cstep;
      }
      goto LAB_0042e99c;
    }
    if (bVar11 != 4) goto LAB_0042e99c;
    Mat::reshape(&local_c0,&local_78,_w,_h,(Allocator *)0x0);
    convert_packing(&local_c0,&this->weight_data_tm,4,opt);
    if (local_c0.refcount == (int *)0x0) goto LAB_0042e99c;
    LOCK();
    *local_c0.refcount = *local_c0.refcount + -1;
    UNLOCK();
    if (*local_c0.refcount != 0) goto LAB_0042e99c;
    if (local_c0.allocator != (Allocator *)0x0) {
      (*(local_c0.allocator)->_vptr_Allocator[3])();
      goto LAB_0042e99c;
    }
  }
  else if (bVar11 == 8) {
    Mat::reshape(&local_c0,&local_78,_w,_h,(Allocator *)0x0);
    convert_packing(&local_c0,&this->weight_data_tm,8,opt);
    if (local_c0.refcount == (int *)0x0) goto LAB_0042e99c;
    LOCK();
    *local_c0.refcount = *local_c0.refcount + -1;
    UNLOCK();
    if (*local_c0.refcount != 0) goto LAB_0042e99c;
    if (local_c0.allocator != (Allocator *)0x0) {
      (*(local_c0.allocator)->_vptr_Allocator[3])();
      goto LAB_0042e99c;
    }
  }
  else {
    if (bVar11 != 0x10) goto LAB_0042e99c;
    Mat::reshape(&local_c0,&local_78,_w,_h,(Allocator *)0x0);
    convert_packing(&local_c0,&this->weight_data_tm,0x10,opt);
    if (local_c0.refcount == (int *)0x0) goto LAB_0042e99c;
    LOCK();
    *local_c0.refcount = *local_c0.refcount + -1;
    UNLOCK();
    if (*local_c0.refcount != 0) goto LAB_0042e99c;
    if (local_c0.allocator != (Allocator *)0x0) {
      (*(local_c0.allocator)->_vptr_Allocator[3])();
      goto LAB_0042e99c;
    }
  }
  if (local_c0.data != (void *)0x0) {
    free(local_c0.data);
  }
LAB_0042e99c:
  if (opt->lightmode == true) {
    piVar4 = (this->super_DeconvolutionDepthWise).weight_data.refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        pvVar6 = (this->super_DeconvolutionDepthWise).weight_data.data;
        pAVar5 = (this->super_DeconvolutionDepthWise).weight_data.allocator;
        if (pAVar5 == (Allocator *)0x0) {
          if (pvVar6 != (void *)0x0) {
            free(pvVar6);
          }
        }
        else {
          (*pAVar5->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_DeconvolutionDepthWise).weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_DeconvolutionDepthWise).weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_DeconvolutionDepthWise).weight_data.elemsize + 4) = 0;
    pMVar1->data = (void *)0x0;
    (this->super_DeconvolutionDepthWise).weight_data.refcount = (int *)0x0;
    (this->super_DeconvolutionDepthWise).weight_data.dims = 0;
    (this->super_DeconvolutionDepthWise).weight_data.w = 0;
    (this->super_DeconvolutionDepthWise).weight_data.h = 0;
    (this->super_DeconvolutionDepthWise).weight_data.d = 0;
    (this->super_DeconvolutionDepthWise).weight_data.c = 0;
  }
  piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,(int)local_78.refcount);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_78.data != (Allocator *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return 0;
}

Assistant:

int DeconvolutionDepthWise_x86_avx512::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            elempack = channels % 16 == 0 ? 16 : channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#elif __AVX__
            elempack = channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#else
            elempack = channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        Mat weight_data_transposed(weight_data.w);
        {
            float* pt = weight_data_transposed;
            const float* p = weight_data;

            for (int i = 0; i < (channels / group) * (num_output / group) * group; i++)
            {
                for (int k = 0; k < maxk; k++)
                {
                    pt[maxk - 1 - k] = p[k];
                }

                p += maxk;
                pt += maxk;
            }
        }

#if __SSE2__
#if __AVX__
        // pack16
#if __AVX512F__
        if (elempack == 16)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 16, opt);
        }
#endif // __AVX512F__

        // pack8
        if (elempack == 8)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 8, opt);
        }
#endif // __AVX__

        // pack4
        if (elempack == 4)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 4, opt);
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            weight_data_tm = weight_data_transposed;
        }

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    // group convolution
    create_group_ops(opt);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}